

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

float make_qp_quants(int n,int nmax,float *x,uint8_t *L,float *quant_weights)

{
  uint uVar1;
  int is;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar8 = 0.0;
  if (0 < n) {
    uVar3 = 0;
    do {
      if (fVar8 <= x[uVar3]) {
        fVar8 = x[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    fVar7 = (float)nmax / fVar8;
    if (0 < n) {
      uVar3 = 0;
      do {
        L[uVar3] = SUB41(x[uVar3] * fVar7 + 12582912.0,0);
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
    if (n < 1) {
      fVar9 = 0.0;
    }
    else {
      fVar9 = 0.0;
      uVar3 = 0;
      do {
        fVar10 = (float)L[uVar3] * (-1.0 / fVar7) + x[uVar3];
        fVar9 = fVar9 + quant_weights[uVar3] * fVar10 * fVar10;
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
    uVar3 = (ulong)(uint)n;
    iVar2 = -4;
    do {
      fVar10 = fVar9;
      if (iVar2 != 0) {
        fVar11 = ((float)iVar2 * 0.1 + (float)nmax) / fVar8;
        if (n < 1) {
          fVar12 = 0.0;
        }
        else {
          fVar12 = 0.0;
          uVar4 = 0;
          do {
            iVar5 = ((uint)(fVar11 * x[uVar4] + 12582912.0) & 0x7fffff) - 0x400000;
            if (nmax <= iVar5) {
              iVar5 = nmax;
            }
            fVar10 = (float)iVar5 * (-1.0 / fVar11) + x[uVar4];
            fVar12 = fVar12 + quant_weights[uVar4] * fVar10 * fVar10;
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        fVar10 = fVar12;
        if (fVar9 <= fVar12) {
          fVar10 = fVar9;
        }
        fVar7 = (float)(~-(uint)(fVar12 < fVar9) & (uint)fVar7 |
                       (uint)fVar11 & -(uint)(fVar12 < fVar9));
      }
      iVar2 = iVar2 + 1;
      fVar9 = fVar10;
    } while (iVar2 != 5);
    fVar8 = 0.0;
    fVar9 = 0.0;
    if (0 < n) {
      uVar4 = 0;
      do {
        fVar10 = x[uVar4];
        iVar2 = ((uint)(fVar7 * fVar10 + 12582912.0) & 0x7fffff) - 0x400000;
        if (nmax <= iVar2) {
          iVar2 = nmax;
        }
        fVar11 = (float)iVar2;
        L[uVar4] = (uint8_t)iVar2;
        fVar8 = fVar8 + fVar11 * fVar11 * quant_weights[uVar4];
        fVar9 = fVar9 + fVar11 * fVar10 * quant_weights[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    iVar2 = 0;
    do {
      if (n < 1) {
        bVar6 = true;
      }
      else {
        uVar4 = 0;
        iVar5 = 0;
        do {
          fVar7 = quant_weights[uVar4];
          fVar10 = x[uVar4];
          fVar12 = (float)L[uVar4];
          fVar11 = fVar8 - fVar12 * fVar12 * fVar7;
          fVar12 = fVar9 - fVar12 * fVar10 * fVar7;
          if ((0.0 < fVar12) && (0.0 < fVar11)) {
            uVar1 = ((uint)((fVar10 * fVar11) / fVar12 + 12582912.0) & 0x7fffff) - 0x400000;
            if (nmax <= (int)uVar1) {
              uVar1 = nmax;
            }
            if (uVar1 != L[uVar4]) {
              fVar11 = (float)(int)uVar1 * fVar7 * (float)(int)uVar1 + fVar11;
              fVar12 = (float)(int)uVar1 * fVar7 * fVar10 + fVar12;
              if (fVar9 * fVar9 * fVar11 < fVar12 * fVar12 * fVar8) {
                L[uVar4] = (uint8_t)uVar1;
                iVar5 = iVar5 + 1;
                fVar8 = fVar11;
                fVar9 = fVar12;
              }
            }
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        bVar6 = iVar5 == 0;
      }
    } while ((!bVar6) && (iVar2 = iVar2 + 1, iVar2 != 5));
    fVar9 = fVar9 / fVar8;
  }
  else {
    fVar9 = 0.0;
    if (0 < n) {
      memset(L,0,(ulong)(uint)n);
      fVar9 = 0.0;
    }
  }
  return fVar9;
}

Assistant:

static float make_qp_quants(int n, int nmax, const float * GGML_RESTRICT x, uint8_t * GGML_RESTRICT L, const float * quant_weights) {
    float max = 0;
    for (int i = 0; i < n; ++i) {
        max = MAX(max, x[i]);
    }
    if (!max) { // all zero
        for (int i = 0; i < n; ++i) { L[i] = 0; }
        return 0.f;
    }
    float iscale = nmax / max;
    for (int i = 0; i < n; ++i) {
        L[i] = nearest_int(iscale * x[i]);
    }
    float scale = 1/iscale;
    float best_mse = 0;
    for (int i = 0; i < n; ++i) {
        float diff = x[i] - scale*L[i];
        float w = quant_weights[i];
        best_mse += w*diff*diff;
    }
    for (int is = -4; is <= 4; ++is) {
        if (is == 0) continue;
        float iscale_is = (0.1f*is + nmax)/max;
        float scale_is = 1/iscale_is;
        float mse = 0;
        for (int i = 0; i < n; ++i) {
            int l = nearest_int(iscale_is*x[i]);
            l = MIN(nmax, l);
            float diff = x[i] - scale_is*l;
            float w = quant_weights[i];
            mse += w*diff*diff;
        }
        if (mse < best_mse) {
            best_mse = mse;
            iscale = iscale_is;
        }
    }
    float sumlx = 0;
    float suml2 = 0;
    for (int i = 0; i < n; ++i) {
        int l = nearest_int(iscale * x[i]);
        l = MIN(nmax, l);
        L[i] = l;
        float w = quant_weights[i];
        sumlx += w*x[i]*l;
        suml2 += w*l*l;
    }
    for (int itry = 0; itry < 5; ++itry) {
        int n_changed = 0;
        for (int i = 0; i < n; ++i) {
            float w = quant_weights[i];
            float slx = sumlx - w*x[i]*L[i];
            float sl2 = suml2 - w*L[i]*L[i];
            if (slx > 0 && sl2 > 0) {
                int new_l = nearest_int(x[i] * sl2 / slx);
                new_l = MIN(nmax, new_l);
                if (new_l != L[i]) {
                    slx += w*x[i]*new_l;
                    sl2 += w*new_l*new_l;
                    if (slx*slx*suml2 > sumlx*sumlx*sl2) {
                        L[i] = new_l; sumlx = slx; suml2 = sl2;
                        ++n_changed;
                    }
                }
            }
        }
        if (!n_changed) {
            break;
        }
    }
    return sumlx/suml2;
}